

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

void __thiscall RtAudio::RtAudio(RtAudio *this,Api api,RtAudioErrorCallback *errorCallback)

{
  RtApi *pRVar1;
  pointer pbVar2;
  pointer pAVar3;
  pointer pbVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  string errorMessage;
  vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> apis;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  vector<RtAudio::Api,_std::allocator<RtAudio::Api>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  this->rtapi_ = (RtApi *)0x0;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  if (api != UNSPECIFIED) {
    openRtApi(this,api);
    pRVar1 = this->rtapi_;
    if (pRVar1 != (RtApi *)0x0) {
      if ((errorCallback->super__Function_base)._M_manager != (_Manager_type)0x0) {
        std::
        function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_50,errorCallback);
        std::
        function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator=(&pRVar1->errorCallback_,
                    (function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     *)&local_50);
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
      }
      goto LAB_0010a5ac;
    }
    std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)local_c8._M_string_length,0x115300);
    if ((errorCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
      local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 10;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)&local_a8,1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_a8.
                             super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl
                             .super__Vector_impl_data._M_start._1_7_,10);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_a8,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    else {
      local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_a8.
                             super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,8);
      (*errorCallback->_M_invoker)
                ((_Any_data *)errorCallback,(RtAudioErrorType *)&local_a8,&local_c8);
    }
  }
  local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getCompiledApi(&local_a8);
  pAVar3 = local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_a8.super__Vector_base<RtAudio::Api,_std::allocator<RtAudio::Api>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar6 != 0) {
    uVar7 = 0;
    do {
      openRtApi(this,pAVar3[uVar7]);
      if (this->rtapi_ != (RtApi *)0x0) {
        RtApi::getDeviceNames_abi_cxx11_(&local_88,this->rtapi_);
        pbVar4 = local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar2 = (pointer)CONCAT71(local_88.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_88.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_1_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_88);
        if (pbVar4 != pbVar2) break;
      }
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (uVar7 < (ulong)(lVar6 >> 2));
  }
  pRVar1 = this->rtapi_;
  if (pRVar1 == (RtApi *)0x0) {
    std::__cxx11::string::operator=
              ((string *)&local_c8,"RtAudio: no compiled API support found ... critical error!");
    if ((errorCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)&local_88,1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = 10;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_88,1);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      std::
      function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(errorCallback,RTAUDIO_INVALID_USE,&local_c8);
    }
    abort();
  }
  if ((errorCallback->super__Function_base)._M_manager != (_Manager_type)0x0) {
    std::
    function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_70,errorCallback);
    std::
    function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator=(&pRVar1->errorCallback_,
                (function<void_(RtAudioErrorType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)&local_70);
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,__destroy_functor);
    }
  }
  if (pAVar3 != (pointer)0x0) {
    operator_delete(pAVar3);
  }
LAB_0010a5ac:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return;
}

Assistant:

RtAudio :: RtAudio( RtAudio::Api api, RtAudioErrorCallback&& errorCallback )
{
  rtapi_ = 0;

  std::string errorMessage;
  if ( api != UNSPECIFIED ) {
    // Attempt to open the specified API.
    openRtApi( api );

    if ( rtapi_ ) {
      if ( errorCallback ) rtapi_->setErrorCallback( errorCallback );
      return;
    }

    // No compiled support for specified API value.  Issue a warning
    // and continue as if no API was specified.
    errorMessage = "RtAudio: no compiled support for specified API argument!";
    if ( errorCallback )
      errorCallback( RTAUDIO_INVALID_USE, errorMessage );
    else
      std::cerr << '\n' << errorMessage << '\n' << std::endl;
  }

  // Iterate through the compiled APIs and return as soon as we find
  // one with at least one device or we reach the end of the list.
  std::vector< RtAudio::Api > apis;
  getCompiledApi( apis );
  for ( unsigned int i=0; i<apis.size(); i++ ) {
    openRtApi( apis[i] );
    if ( rtapi_ && (rtapi_->getDeviceNames()).size() > 0 )
      break;
  }

  if ( rtapi_ ) {
    if ( errorCallback ) rtapi_->setErrorCallback( errorCallback );
    return;
  }

  // It should not be possible to get here because the preprocessor
  // definition __RTAUDIO_DUMMY__ is automatically defined in RtAudio.h
  // if no API-specific definitions are passed to the compiler. But just
  // in case something weird happens, issue an error message and abort.
  errorMessage = "RtAudio: no compiled API support found ... critical error!";
  if ( errorCallback )
    errorCallback( RTAUDIO_INVALID_USE, errorMessage );
  else
    std::cerr << '\n' << errorMessage << '\n' << std::endl;
  abort();
}